

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeChangeToNoop(Vdbe *p,int addr)

{
  Op *pOVar1;
  bool bVar2;
  VdbeOp *pOp;
  int addr_local;
  Vdbe *p_local;
  
  bVar2 = p->db->mallocFailed == '\0';
  if (bVar2) {
    pOVar1 = p->aOp + addr;
    freeP4(p->db,(int)pOVar1->p4type,(pOVar1->p4).p);
    pOVar1->p4type = '\0';
    (pOVar1->p4).p = (void *)0x0;
    pOVar1->opcode = 0xb8;
  }
  p_local._4_4_ = (uint)bVar2;
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeChangeToNoop(Vdbe *p, int addr){
  VdbeOp *pOp;
  if( p->db->mallocFailed ) return 0;
  assert( addr>=0 && addr<p->nOp );
  pOp = &p->aOp[addr];
  freeP4(p->db, pOp->p4type, pOp->p4.p);
  pOp->p4type = P4_NOTUSED;
  pOp->p4.z = 0;
  pOp->opcode = OP_Noop;
  return 1;
}